

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

double despot::DESPOT::WEU(VNode *vnode,double xi)

{
  QNode *pQVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 local_20;
  VNode *root;
  double xi_local;
  VNode *vnode_local;
  
  local_20 = vnode;
  while( true ) {
    pQVar1 = VNode::parent(local_20);
    if (pQVar1 == (QNode *)0x0) break;
    pQVar1 = VNode::parent(local_20);
    local_20 = QNode::parent(pQVar1);
  }
  dVar2 = Gap(vnode);
  dVar3 = VNode::Weight(vnode);
  dVar4 = Gap(local_20);
  return -(xi * dVar3) * dVar4 + dVar2;
}

Assistant:

double DESPOT::WEU(VNode* vnode, double xi) {
	VNode* root = vnode;
	while (root->parent() != NULL) {
		root = root->parent()->parent();
	}
	return Gap(vnode) - xi * vnode->Weight() * Gap(root);
}